

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean inherits(monst *shkp,int numsk,int croaked)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  char *local_158;
  char local_138 [8];
  char takes [256];
  int roomno;
  boolean taken;
  boolean take;
  eshk *eshkp;
  long umoney;
  long loss;
  int croaked_local;
  int numsk_local;
  monst *shkp_local;
  
  umoney = 0;
  takes[0xff] = '\0';
  takes[0xfe] = '\0';
  takes._248_4_ = SEXT14(u.ushops[0]);
  if (numsk < 2) {
    if (((((takes._248_4_ == (int)(char)shkp[0x1b].meating) && (iVar5 = inhishop(shkp), iVar5 != 0))
         && (*(short *)((long)&shkp[0x1b].misc_worn_check + 2) == 0)) &&
        ((iVar5._0_1_ = shkp[0x1b].mtame, iVar5._1_1_ = shkp[0x1b].m_ap_type,
         iVar5._2_1_ = shkp[0x1b].mfrozen, iVar5._3_1_ = shkp[0x1b].mblinded, iVar5 == 0 &&
         (*(int *)&shkp[0x1b].field_0x60 == 0)))) &&
       (((*(uint *)&shkp->field_0x60 >> 0x16 & 1) != 0 &&
        (*(char *)((long)&shkp[0x1b].meating + 1) == '\0')))) {
      if (invent != (obj *)0x0) {
        pcVar6 = shkname(shkp);
        pline("%s gratefully inherits all your possessions.",pcVar6);
      }
      set_repo_loc((eshk *)&shkp->field_0x74);
      goto LAB_002cbfe8;
    }
    if (((*(short *)((long)&shkp[0x1b].misc_worn_check + 2) != 0) ||
        (*(int *)&shkp[0x1b].field_0x60 != 0)) ||
       (iVar1._0_1_ = shkp[0x1b].mtame, iVar1._1_1_ = shkp[0x1b].m_ap_type,
       iVar1._2_1_ = shkp[0x1b].mfrozen, iVar1._3_1_ = shkp[0x1b].mblinded, iVar1 != 0)) {
      if ((takes._248_4_ == (int)(char)shkp[0x1b].meating) && (iVar5 = inhishop(shkp), iVar5 != 0))
      {
        lVar8 = addupbill(shkp);
        umoney = lVar8 + *(int *)&shkp[0x1b].field_0x60;
      }
      iVar2._0_1_ = shkp[0x1b].mtame;
      iVar2._1_1_ = shkp[0x1b].m_ap_type;
      iVar2._2_1_ = shkp[0x1b].mfrozen;
      iVar2._3_1_ = shkp[0x1b].mblinded;
      if (umoney < iVar2) {
        iVar3._0_1_ = shkp[0x1b].mtame;
        iVar3._1_1_ = shkp[0x1b].m_ap_type;
        iVar3._2_1_ = shkp[0x1b].mfrozen;
        iVar3._3_1_ = shkp[0x1b].mblinded;
        umoney = (long)iVar3;
      }
      takes[0xff] = '\x01';
    }
    if (((*(char *)((long)&shkp[0x1b].meating + 1) == '\0') &&
        ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) != 0)) && (takes[0xff] == '\0'))
    goto LAB_002cbfe8;
    if (invent != (obj *)0x0) {
      lVar8 = money_cnt(invent);
      local_138[0] = '\0';
      if (((*(uint *)&shkp->field_0x60 >> 0x12 & 1) == 0) ||
         ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) != 0)) {
        strcat(local_138,"wakes up and ");
      }
      iVar5 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy);
      if (2 < iVar5) {
        strcat(local_138,"comes and ");
      }
      strcat(local_138,"takes");
      if (((lVar8 < umoney) || (umoney == 0)) || (takes._248_4_ == (int)(char)shkp[0x1b].meating)) {
        *(int *)&shkp[0x1b].mtame = *(int *)&shkp[0x1b].mtame - (int)lVar8;
        iVar4._0_1_ = shkp[0x1b].mtame;
        iVar4._1_1_ = shkp[0x1b].m_ap_type;
        iVar4._2_1_ = shkp[0x1b].mfrozen;
        iVar4._3_1_ = shkp[0x1b].mblinded;
        if (iVar4 < 0) {
          shkp[0x1b].mtame = '\0';
          shkp[0x1b].m_ap_type = '\0';
          shkp[0x1b].mfrozen = '\0';
          shkp[0x1b].mblinded = '\0';
        }
        if (0 < lVar8) {
          money2mon(shkp,lVar8);
        }
        iflags.botl = '\x01';
        pcVar6 = shkname(shkp);
        pline("%s %s all your possessions.",pcVar6,local_138);
        takes[0xfe] = '\x01';
        set_repo_loc((eshk *)&shkp->field_0x74);
      }
      else {
        money2mon(shkp,umoney);
        iflags.botl = '\x01';
        pcVar6 = Monnam(shkp);
        pcVar7 = currency(umoney);
        iVar5 = strncmp(&shkp[0x1b].field_0x75,plname,0x20);
        pcVar10 = "you ";
        if (iVar5 != 0) {
          pcVar10 = "";
        }
        pcVar9 = "him";
        if ((*(uint *)&shkp->field_0x60 & 1) != 0) {
          pcVar9 = "her";
        }
        pline("%s %s the %ld %s %sowed %s.",pcVar6,local_138,umoney,pcVar7,pcVar10,pcVar9,pcVar6);
        pacify_shk(shkp);
        *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
        shkp[0x1b].mtame = '\0';
        shkp[0x1b].m_ap_type = '\0';
        shkp[0x1b].mfrozen = '\0';
        shkp[0x1b].mblinded = '\0';
      }
    }
  }
  else {
    if (((viz_array[shkp->my][shkp->mx] & 2U) != 0) && (croaked != 0)) {
      pcVar6 = Monnam(shkp);
      bVar11 = true;
      if ((*(uint *)&shkp->field_0x60 >> 0x12 & 1) != 0) {
        bVar11 = (*(uint *)&shkp->field_0x60 >> 0x13 & 1) != 0;
      }
      pcVar7 = "";
      if (bVar11) {
        pcVar7 = "wakes up, ";
      }
      iVar5 = rn2(2);
      if (iVar5 == 0) {
        local_158 = ", shakes his head,";
        if ((*(uint *)&shkp->field_0x60 & 1) != 0) {
          local_158 = ", shakes her head,";
        }
      }
      else {
        local_158 = "";
      }
      iVar5 = inhishop(shkp);
      pcVar10 = "sighs";
      if (iVar5 == 0) {
        pcVar10 = "disappears";
      }
      pline("%s %slooks at your corpse%s and %s.",pcVar6,pcVar7,local_158,pcVar10);
    }
    rouse_shk(shkp,'\0');
    takes[0xfe] = takes._248_4_ == (int)(char)shkp[0x1b].meating;
  }
  rouse_shk(shkp,'\0');
  iVar5 = inhishop(shkp);
  if (iVar5 == 0) {
    home_shk(shkp,'\0');
  }
LAB_002cbfe8:
  setpaid(shkp);
  return takes[0xfe];
}

Assistant:

static boolean inherits(struct monst *shkp, int numsk, int croaked)
{
	long loss = 0L;
	long umoney;
	struct eshk *eshkp = ESHK(shkp);
	boolean take = FALSE, taken = FALSE;
	int roomno = *u.ushops;
	char takes[BUFSZ];

	/* the simplifying principle is that first-come */
	/* already took everything you had.		*/
	if (numsk > 1) {
	    if (cansee(shkp->mx, shkp->my) && croaked)
		pline("%s %slooks at your corpse%s and %s.",
		      Monnam(shkp),
		      (!shkp->mcanmove || shkp->msleeping) ? "wakes up, " : "",
		      !rn2(2) ? (shkp->female ? ", shakes her head," :
			   ", shakes his head,") : "",
		      !inhishop(shkp) ? "disappears" : "sighs");
	    rouse_shk(shkp, FALSE);	/* wake shk for bones */
	    taken = (roomno == eshkp->shoproom);
	    goto skip;
	}

	/* get one case out of the way: you die in the shop, the */
	/* shopkeeper is peaceful, nothing stolen, nothing owed. */
	if (roomno == eshkp->shoproom && inhishop(shkp) &&
	    !eshkp->billct && !eshkp->robbed && !eshkp->debit &&
	     NOTANGRY(shkp) && !eshkp->following) {
		if (invent)
			pline("%s gratefully inherits all your possessions.",
				shkname(shkp));
		set_repo_loc(eshkp);
		goto clear;
	}

	if (eshkp->billct || eshkp->debit || eshkp->robbed) {
		if (roomno == eshkp->shoproom && inhishop(shkp))
		    loss = addupbill(shkp) + eshkp->debit;
		if (loss < eshkp->robbed) loss = eshkp->robbed;
		take = TRUE;
	}

	if (eshkp->following || ANGRY(shkp) || take) {
		if (!invent) goto skip;
                umoney = money_cnt(invent);
		takes[0] = '\0';
		if (!shkp->mcanmove || shkp->msleeping)
			strcat(takes, "wakes up and ");
		if (distu(shkp->mx, shkp->my) > 2)
			strcat(takes, "comes and ");
		strcat(takes, "takes");

		if (loss > umoney || !loss || roomno == eshkp->shoproom) {
			eshkp->robbed -= umoney;
			if (eshkp->robbed < 0L) eshkp->robbed = 0L;
                        if (umoney > 0) money2mon(shkp, umoney);
			iflags.botl = 1;
			pline("%s %s all your possessions.",
			      shkname(shkp), takes);
			taken = TRUE;
			/* where to put player's invent (after disclosure) */
			set_repo_loc(eshkp);
		} else {
                        money2mon(shkp, loss);
			iflags.botl = 1;
			pline("%s %s the %ld %s %sowed %s.",
			      Monnam(shkp), takes,
			      loss, currency(loss),
			      strncmp(eshkp->customer, plname, PL_NSIZ) ?
					"" : "you ",
			      shkp->female ? "her" : "him");
			/* shopkeeper has now been paid in full */
			pacify_shk(shkp);
			eshkp->following = 0;
			eshkp->robbed = 0L;
		}
skip:
		/* in case we create bones */
		rouse_shk(shkp, FALSE);	/* wake up */
		if (!inhishop(shkp))
			home_shk(shkp, FALSE);
	}
clear:
	setpaid(shkp);
	return taken;
}